

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O2

int32_t __thiscall
aeron::concurrent::logbuffer::ExclusiveTermAppender::appendUnfragmentedMessage
          (ExclusiveTermAppender *this,int32_t termId,int32_t termOffset,HeaderWriter *header,
          AtomicBuffer *srcBuffer,index_t srcOffset,index_t length,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  uint __args_2;
  length_t termLength;
  int32_t iVar1;
  long v;
  int iVar2;
  
  termLength = this->m_termBuffer->m_length;
  iVar2 = (length + 0x3fU & 0xffffffe0) + termOffset;
  *this->m_tailAddr = CONCAT44(termId,iVar2);
  if ((int)termLength < iVar2) {
    iVar1 = handleEndOfLogCondition(this->m_termBuffer,termId,termOffset,header,termLength);
    return iVar1;
  }
  __args_2 = length + 0x20;
  HeaderWriter::write(header,(int)this->m_termBuffer,(void *)(ulong)(uint)termOffset,(ulong)__args_2
                     );
  AtomicBuffer::putBytes(this->m_termBuffer,termOffset + 0x20,srcBuffer,srcOffset,length);
  v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                (reservedValueSupplier,this->m_termBuffer,termOffset,__args_2);
  AtomicBuffer::putInt64(this->m_termBuffer,termOffset + 0x18,v);
  AtomicBuffer::putInt32Ordered(this->m_termBuffer,termOffset,__args_2);
  return iVar2;
}

Assistant:

inline std::int32_t appendUnfragmentedMessage(
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        const util::index_t frameLength = length + DataFrameHeader::LENGTH;
        const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

        const std::int32_t termLength = m_termBuffer.capacity();

        std::int32_t resultingOffset = termOffset + alignedLength;
        putRawTailOrdered(termId, resultingOffset);

        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termId, termOffset, header, termLength);
        }
        else
        {
            header.write(m_termBuffer, termOffset, frameLength, termId);
            m_termBuffer.putBytes(termOffset + DataFrameHeader::LENGTH, srcBuffer, srcOffset, length);

            const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, termOffset, frameLength);
            m_termBuffer.putInt64(termOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

            FrameDescriptor::frameLengthOrdered(m_termBuffer, termOffset, frameLength);
        }

        return resultingOffset;
    }